

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

bool google::FindSymbol(uint64_t pc,int fd,char *out,int out_size,uint64_t symbol_offset,
                       Elf64_Shdr *strtab,Elf64_Shdr *symtab)

{
  Elf64_Sym *pEVar1;
  Elf64_Off EVar2;
  Elf64_Xword EVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  ssize_t sVar8;
  void *pvVar9;
  long lVar10;
  ssize_t len1;
  uint64_t end_address;
  uint64_t start_address;
  Elf64_Sym *symbol;
  int j;
  ssize_t num_symbols_in_buf;
  ssize_t len;
  int local_360;
  int local_35c;
  uint local_358;
  int num_symbols_to_read;
  Elf64_Sym buf [32];
  off_t offset;
  int i;
  int num_symbols;
  Elf64_Shdr *strtab_local;
  uint64_t symbol_offset_local;
  int out_size_local;
  char *out_local;
  int fd_local;
  uint64_t pc_local;
  
  if (symtab != (Elf64_Shdr *)0x0) {
    iVar5 = (int)(symtab->sh_size / symtab->sh_entsize);
    for (offset._0_4_ = 0; (int)offset < iVar5; offset._0_4_ = (int)offset + (int)uVar7) {
      EVar2 = symtab->sh_offset;
      EVar3 = symtab->sh_entsize;
      local_360 = 0x20;
      len._4_4_ = iVar5 - (int)offset;
      piVar6 = std::min<int>(&local_360,(int *)((long)&len + 4));
      local_35c = *piVar6;
      uVar7 = ReadFromOffset(fd,&local_358,(long)local_35c * 0x18,EVar2 + (long)(int)offset * EVar3)
      ;
      if (uVar7 % 0x18 != 0) {
        AssertFail();
      }
      uVar7 = uVar7 / 0x18;
      if ((long)local_35c < (long)uVar7) {
        AssertFail();
      }
      for (symbol._4_4_ = 0; (long)symbol._4_4_ < (long)uVar7; symbol._4_4_ = symbol._4_4_ + 1) {
        lVar10 = (long)symbol._4_4_;
        pEVar1 = buf + lVar10;
        lVar4._0_4_ = pEVar1->st_name;
        lVar4._4_1_ = pEVar1->st_info;
        lVar4._5_1_ = pEVar1->st_other;
        lVar4._6_2_ = pEVar1->st_shndx;
        if ((((lVar4 != 0) && (*(short *)((long)&buf[lVar10 + -1].st_size + 6) != 0)) &&
            (symbol_offset + *(long *)(buf + lVar10) <= pc)) &&
           (pc < symbol_offset + *(long *)(buf + lVar10) + buf[lVar10].st_value)) {
          sVar8 = ReadFromOffset(fd,out,(long)out_size,
                                 strtab->sh_offset + (ulong)(&local_358)[lVar10 * 6]);
          if ((0 < sVar8) && (pvVar9 = memchr(out,0,(long)out_size), pvVar9 != (void *)0x0)) {
            return true;
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

static ATTRIBUTE_NOINLINE bool
FindSymbol(uint64_t pc, const int fd, char *out, int out_size,
           uint64_t symbol_offset, const ElfW(Shdr) *strtab,
           const ElfW(Shdr) *symtab) {
  if (symtab == NULL) {
    return false;
  }
  const int num_symbols = symtab->sh_size / symtab->sh_entsize;
  for (int i = 0; i < num_symbols;) {
    off_t offset = symtab->sh_offset + i * symtab->sh_entsize;

    // If we are reading Elf64_Sym's, we want to limit this array to
    // 32 elements (to keep stack consumption low), otherwise we can
    // have a 64 element Elf32_Sym array.
#if __WORDSIZE == 64
#define NUM_SYMBOLS 32
#else
#define NUM_SYMBOLS 64
#endif

    // Read at most NUM_SYMBOLS symbols at once to save read() calls.
    ElfW(Sym) buf[NUM_SYMBOLS];
    int num_symbols_to_read = std::min(NUM_SYMBOLS, num_symbols - i);
    const ssize_t len =
        ReadFromOffset(fd, &buf, sizeof(buf[0]) * num_symbols_to_read, offset);
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_symbols_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_symbols_in_buf <= num_symbols_to_read);
    for (int j = 0; j < num_symbols_in_buf; ++j) {
      const ElfW(Sym)& symbol = buf[j];
      uint64_t start_address = symbol.st_value;
      start_address += symbol_offset;
      uint64_t end_address = start_address + symbol.st_size;
      if (symbol.st_value != 0 &&  // Skip null value symbols.
          symbol.st_shndx != 0 &&  // Skip undefined symbols.
          start_address <= pc && pc < end_address) {
        ssize_t len1 = ReadFromOffset(fd, out, out_size,
                                      strtab->sh_offset + symbol.st_name);
        if (len1 <= 0 || memchr(out, '\0', out_size) == NULL) {
          return false;
        }
        return true;  // Obtained the symbol name.
      }
    }
    i += num_symbols_in_buf;
  }
  return false;
}